

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O2

uint Kit_TruthIsop5_rec(uint uOn,uint uOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  int *piVar1;
  Vec_Int_t *vStore_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uOnDc1;
  uint uOnDc0;
  uint uOn1;
  uint uOn0;
  uint uOnDc_local;
  uint uOn_local;
  uint local_6c;
  Vec_Int_t *local_68;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  
  uOnDc_local = uOnDc;
  uOn_local = uOn;
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                  ,0x118,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (uOn == 0) {
    pcRes->nLits = 0;
    pcRes->nCubes = 0;
    pcRes->pCubes = (uint *)0x0;
  }
  else if (uOnDc == 0xffffffff) {
    pcRes->nLits = 0;
    pcRes->nCubes = 1;
    iVar8 = vStore->nSize;
    vStore->nSize = iVar8 + 1;
    if (iVar8 < vStore->nCap) {
      piVar1 = vStore->pArray;
      pcRes->pCubes = (uint *)(piVar1 + iVar8);
      piVar1[iVar8] = 0;
      return 0xffffffff;
    }
    pcRes->pCubes = (uint *)0x0;
    pcRes->nCubes = -1;
  }
  else {
    local_68 = vStore;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                    ,0x12d,
                    "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    iVar8 = nVars * 2;
    do {
      uVar3 = nVars;
      iVar8 = iVar8 + -2;
      if ((int)uVar3 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                      ,0x133,
                      "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      nVars = uVar3 - 1;
      iVar2 = Kit_TruthVarInSupport(&uOn_local,5,nVars);
    } while ((iVar2 == 0) && (iVar2 = Kit_TruthVarInSupport(&uOnDc_local,5,nVars), iVar2 == 0));
    uOn1 = uOn_local;
    uOn0 = uOn_local;
    uOnDc1 = uOnDc_local;
    uOnDc0 = uOnDc_local;
    Kit_TruthCofactor0(&uOn0,uVar3,nVars);
    Kit_TruthCofactor1(&uOn1,uVar3,nVars);
    Kit_TruthCofactor0(&uOnDc0,uVar3,nVars);
    Kit_TruthCofactor1(&uOnDc1,uVar3,nVars);
    vStore_00 = local_68;
    uVar3 = Kit_TruthIsop5_rec(~uOnDc1 & uOn0,uOnDc0,nVars,&cRes0,local_68);
    if ((cRes0.nCubes == -1) ||
       ((uVar4 = Kit_TruthIsop5_rec(~uOnDc0 & uOn1,uOnDc1,nVars,&cRes1,vStore_00),
        cRes1.nCubes == -1 ||
        (local_6c = Kit_TruthIsop5_rec(~uVar4 & uOn1 | ~uVar3 & uOn0,uOnDc1 & uOnDc0,nVars,&cRes2,
                                       vStore_00), cRes2.nCubes == -1)))) {
      pcRes->nCubes = -1;
    }
    else {
      pcRes->nLits = cRes0.nLits + cRes1.nCubes + cRes0.nCubes + cRes1.nLits + cRes2.nLits;
      iVar2 = cRes1.nCubes + cRes0.nCubes + cRes2.nCubes;
      pcRes->nCubes = iVar2;
      puVar5 = Vec_IntFetch(local_68,iVar2);
      pcRes->pCubes = puVar5;
      if (puVar5 != (uint *)0x0) {
        uVar6 = 0;
        uVar9 = (ulong)(uint)cRes0.nCubes;
        if (cRes0.nCubes < 1) {
          uVar9 = uVar6;
        }
        for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
          puVar5[uVar6] = cRes0.pCubes[uVar6] | 1 << ((byte)iVar8 & 0x1f);
        }
        uVar7 = 0;
        uVar6 = (ulong)(uint)cRes1.nCubes;
        if (cRes1.nCubes < 1) {
          uVar6 = uVar7;
        }
        puVar5 = puVar5 + uVar9;
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *puVar5 = cRes1.pCubes[uVar7] | 2 << ((byte)iVar8 & 0x1f);
          puVar5 = puVar5 + 1;
        }
        iVar8 = 0;
        if (cRes2.nCubes < 1) {
          cRes2.nCubes = 0;
        }
        for (uVar6 = 0; (uint)cRes2.nCubes != uVar6; uVar6 = uVar6 + 1) {
          *puVar5 = cRes2.pCubes[uVar6];
          puVar5 = puVar5 + 1;
          iVar8 = iVar8 + -1;
        }
        if ((iVar8 + pcRes->nCubes) - (int)uVar9 == (int)uVar7) {
          return uVar4 & *(uint *)(&DAT_007c22b0 + (ulong)(uint)nVars * 4) | local_6c |
                 uVar3 & ~*(uint *)(&DAT_007c22b0 + (ulong)(uint)nVars * 4);
        }
        __assert_fail("k == pcRes->nCubes",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                      ,0x15e,
                      "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      pcRes->nCubes = -1;
    }
  }
  return 0;
}

Assistant:

unsigned Kit_TruthIsop5_rec( unsigned uOn, unsigned uOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int i, k, Var;
    assert( nVars <= 5 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        return 0;
    }
    if ( uOnDc == 0xFFFFFFFF )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return 0;
        }
        pcRes->pCubes[0] = 0;
        return 0xFFFFFFFF;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( &uOn, 5, Var ) || 
             Kit_TruthVarInSupport( &uOnDc, 5, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = uOn1   = uOn;
    uOnDc0 = uOnDc1 = uOnDc;
    Kit_TruthCofactor0( &uOn0, Var + 1, Var );
    Kit_TruthCofactor1( &uOn1, Var + 1, Var );
    Kit_TruthCofactor0( &uOnDc0, Var + 1, Var );
    Kit_TruthCofactor1( &uOnDc1, Var + 1, Var );
    // solve for cofactors
    uRes0 = Kit_TruthIsop5_rec( uOn0 & ~uOnDc1, uOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes1 = Kit_TruthIsop5_rec( uOn1 & ~uOnDc0, uOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes2 = Kit_TruthIsop5_rec( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & ~uMasks[Var]) | (uRes1 & uMasks[Var]);
//    assert( (uOn & ~uRes2) == 0 );
//    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}